

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

HTS_Boolean HTS_Question_load(HTS_Question *question,HTS_File *fp)

{
  HTS_Boolean HVar1;
  char *pcVar2;
  HTS_Pattern *pHVar3;
  HTS_Pattern *pHVar4;
  _HTS_Pattern **pp_Var5;
  char buff [1024];
  short local_438 [516];
  
  if (fp == (HTS_File *)0x0 || question == (HTS_Question *)0x0) {
    return '\0';
  }
  HTS_Question_clear(question);
  HVar1 = HTS_get_pattern_token(fp,(char *)local_438);
  if (HVar1 != '\0') {
    pcVar2 = HTS_strdup((char *)local_438);
    question->string = pcVar2;
    HVar1 = HTS_get_pattern_token(fp,(char *)local_438);
    if (HVar1 != '\0') {
      if (local_438[0] != 0x7b) {
        return '\x01';
      }
      pHVar4 = (HTS_Pattern *)0x0;
      while (HVar1 = HTS_get_pattern_token(fp,(char *)local_438), HVar1 != '\0') {
        pHVar3 = (HTS_Pattern *)HTS_calloc(1,0x10);
        pp_Var5 = &pHVar4->next;
        if (question->head == (HTS_Pattern *)0x0) {
          pp_Var5 = &question->head;
        }
        *pp_Var5 = pHVar3;
        pcVar2 = HTS_strdup((char *)local_438);
        pHVar3->string = pcVar2;
        pHVar3->next = (_HTS_Pattern *)0x0;
        HVar1 = HTS_get_pattern_token(fp,(char *)local_438);
        if (HVar1 == '\0') break;
        pHVar4 = pHVar3;
        if (local_438[0] == 0x7d) {
          return '\x01';
        }
      }
    }
    HTS_Question_clear(question);
  }
  return '\0';
}

Assistant:

static HTS_Boolean HTS_Question_load(HTS_Question * question, HTS_File * fp)
{
   char buff[HTS_MAXBUFLEN];
   HTS_Pattern *pattern, *last_pattern;

   if (question == NULL || fp == NULL)
      return FALSE;

   HTS_Question_clear(question);

   /* get question name */
   if (HTS_get_pattern_token(fp, buff) == FALSE)
      return FALSE;
   question->string = HTS_strdup(buff);

   /* get pattern list */
   if (HTS_get_pattern_token(fp, buff) == FALSE) {
      HTS_Question_clear(question);
      return FALSE;
   }

   last_pattern = NULL;
   if (strcmp(buff, "{") == 0) {
      while (1) {
         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            HTS_Question_clear(question);
            return FALSE;
         }
         pattern = (HTS_Pattern *) HTS_calloc(1, sizeof(HTS_Pattern));
         if (question->head != NULL)
            last_pattern->next = pattern;
         else                   /* first time */
            question->head = pattern;
         pattern->string = HTS_strdup(buff);
         pattern->next = NULL;
         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            HTS_Question_clear(question);
            return FALSE;
         }
         if (!strcmp(buff, "}"))
            break;
         last_pattern = pattern;
      }
   }
   return TRUE;
}